

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_utctm.cc
# Opt level: O0

ASN1_UTCTIME * ASN1_UTCTIME_adj(ASN1_UTCTIME *s,time_t t,int offset_day,long offset_sec)

{
  bool bVar1;
  int iVar2;
  size_t len_s;
  int free_s;
  int ret;
  char buf [14];
  tm data;
  long offset_sec_local;
  int offset_day_local;
  int64_t posix_time_local;
  ASN1_UTCTIME *s_local;
  
  iVar2 = OPENSSL_posix_to_tm(t,(tm *)(buf + 6));
  if (iVar2 == 0) {
    s_local = (ASN1_UTCTIME *)0x0;
  }
  else if (((offset_day == 0) && (offset_sec == 0)) ||
          (iVar2 = OPENSSL_gmtime_adj((tm *)(buf + 6),offset_day,offset_sec), iVar2 != 0)) {
    if ((data.tm_mday < 0x32) || (0x95 < data.tm_mday)) {
      s_local = (ASN1_UTCTIME *)0x0;
    }
    else {
      iVar2 = snprintf((char *)((long)&free_s + 2),0xe,"%02d%02d%02d%02d%02d%02dZ",
                       (long)data.tm_mday % 100 & 0xffffffff,(ulong)(data.tm_hour + 1),
                       (ulong)(uint)data.tm_min,data.tm_sec,buf._10_4_,buf._6_4_);
      if (iVar2 != 0xd) {
        abort();
      }
      bVar1 = false;
      posix_time_local = (int64_t)s;
      if (s == (ASN1_UTCTIME *)0x0) {
        bVar1 = true;
        posix_time_local = (int64_t)ASN1_UTCTIME_new();
        if ((ASN1_UTCTIME *)posix_time_local == (ASN1_UTCTIME *)0x0) {
          return (ASN1_UTCTIME *)0x0;
        }
      }
      len_s = strlen((char *)((long)&free_s + 2));
      iVar2 = ASN1_STRING_set((ASN1_STRING *)posix_time_local,(void *)((long)&free_s + 2),len_s);
      if (iVar2 == 0) {
        if (bVar1) {
          ASN1_UTCTIME_free((ASN1_UTCTIME *)posix_time_local);
        }
        s_local = (ASN1_UTCTIME *)0x0;
      }
      else {
        *(undefined4 *)(posix_time_local + 4) = 0x17;
        s_local = (ASN1_UTCTIME *)posix_time_local;
      }
    }
  }
  else {
    s_local = (ASN1_UTCTIME *)0x0;
  }
  return (ASN1_UTCTIME *)s_local;
}

Assistant:

ASN1_UTCTIME *ASN1_UTCTIME_adj(ASN1_UTCTIME *s, int64_t posix_time,
                               int offset_day, long offset_sec) {
  struct tm data;
  if (!OPENSSL_posix_to_tm(posix_time, &data)) {
    return NULL;
  }

  if (offset_day || offset_sec) {
    if (!OPENSSL_gmtime_adj(&data, offset_day, offset_sec)) {
      return NULL;
    }
  }

  if (data.tm_year < 50 || data.tm_year >= 150) {
    return NULL;
  }

  char buf[14];
  int ret = snprintf(buf, sizeof(buf), "%02d%02d%02d%02d%02d%02dZ",
                     data.tm_year % 100, data.tm_mon + 1, data.tm_mday,
                     data.tm_hour, data.tm_min, data.tm_sec);
  // |snprintf| must write exactly 15 bytes (plus the NUL) to the buffer.
  BSSL_CHECK(ret == static_cast<int>(sizeof(buf) - 1));

  int free_s = 0;
  if (s == NULL) {
    free_s = 1;
    s = ASN1_UTCTIME_new();
    if (s == NULL) {
      return NULL;
    }
  }

  if (!ASN1_STRING_set(s, buf, strlen(buf))) {
    if (free_s) {
      ASN1_UTCTIME_free(s);
    }
    return NULL;
  }
  s->type = V_ASN1_UTCTIME;
  return s;
}